

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ImDrawList *pIVar6;
  char *pcVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar5 = window->WasActive;
    uVar9 = (uint)(GImGui->NavWindow == window);
    if (bVar5 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      bVar3 = TreeNodeEx(label,uVar9,"%s \'%s\'%s",label,window->Name," *Inactive*");
      PopStyleColor(1);
      IsItemHovered(0);
    }
    else {
      bVar3 = TreeNodeEx(label,uVar9,"%s \'%s\'%s",label,window->Name,"");
      bVar4 = IsItemHovered(0);
      if ((bVar4 & bVar5) == 1) {
        pIVar6 = GetForegroundDrawList();
        local_68.x = (window->Size).x + (window->Pos).x;
        local_68.y = (window->Size).y + (window->Pos).y;
        ImDrawList::AddRect(pIVar6,&window->Pos,&local_68,0xff00ffff,0.0,0,1.0);
      }
    }
    if (bVar3 != false) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar9 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,SUB84((double)(window->Size).x,0),
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar8 = "Child ";
      if ((uVar9 >> 0x18 & 1) == 0) {
        pcVar8 = "";
      }
      auVar23._0_4_ = -(uint)((uVar9 & 0x10000000) == 0);
      auVar23._4_4_ = -(uint)((uVar9 & 0x8000000) == 0);
      auVar23._8_4_ = -(uint)((uVar9 & 0x4000000) == 0);
      auVar23._12_4_ = -(uint)((uVar9 & 0x2000000) == 0);
      auVar22._0_4_ = -(uint)((uVar9 & 0x40) == 0);
      auVar22._4_4_ = -(uint)((uVar9 & 0x40000) == 0);
      auVar22._8_4_ = -(uint)((uVar9 & 0x200) == 0);
      auVar22._12_4_ = -(uint)((uVar9 & 0x100) == 0);
      auVar23 = packssdw(auVar22,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      pcVar7 = "Tooltip ";
      if ((auVar23 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar7 = "";
      }
      pcVar11 = "Popup ";
      if ((auVar23 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar11 = "";
      }
      pcVar13 = "Modal ";
      if ((auVar23 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar14 = "ChildMenu ";
      if ((auVar23 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar15 = "NoSavedSettings ";
      if ((auVar23 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar18 = "NoMouseInputs";
      if ((auVar23 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "";
      }
      pcVar16 = "NoNavInputs";
      if ((auVar23 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "";
      }
      pcVar17 = "AlwaysAutoResize";
      if ((auVar23 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar17 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar9,pcVar8,pcVar7,pcVar11,pcVar13,
                 pcVar14,pcVar15,pcVar18,pcVar16,pcVar17);
      pcVar8 = "X";
      if (window->ScrollbarX == false) {
        pcVar8 = "";
      }
      pcVar7 = "Y";
      if (window->ScrollbarY == false) {
        pcVar7 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,SUB84((double)(window->Scroll).y,0),
                 (double)(window->ScrollMax).y,pcVar8,pcVar7);
      if ((window->Active != false) || (uVar12 = 0xffffffff, window->WasActive != false)) {
        uVar12 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar12)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar10 = 0;
      bVar5 = true;
      do {
        bVar3 = bVar5;
        IVar1 = window->NavRectRel[lVar10].Min;
        IVar2 = window->NavRectRel[lVar10].Max;
        fVar20 = IVar2.y;
        if ((IVar1.x < fVar20) || (IVar1.y < fVar20)) {
          uStack_50 = 0;
          uStack_40 = 0;
          local_58 = IVar1;
          local_48 = IVar2;
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)IVar1.x,
                     (double)IVar1.y,SUB84((double)IVar2.x,0),(double)fVar20,lVar10,
                     (ulong)window->NavLastIds[lVar10]);
          bVar5 = IsItemHovered(0);
          if (bVar5) {
            pIVar6 = GetForegroundDrawList();
            fVar20 = (window->Pos).x;
            local_68.x = local_58.x + fVar20;
            fVar21 = (window->Pos).y;
            local_68.y = local_58.y + fVar21;
            local_60.x = local_48.x + fVar20;
            local_60.y = local_48.y + fVar21;
            ImDrawList::AddRect(pIVar6,&local_68,&local_60,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",lVar10,(ulong)window->NavLastIds[lVar10]);
        }
        lVar10 = 1;
        bVar5 = false;
      } while (bVar3);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar8 = "NULL";
      }
      else {
        pcVar8 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar8);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar5 = TreeNode("Columns","Columns sets (%d)");
        if (bVar5) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar10 = 0;
            lVar19 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar10));
              lVar19 = lVar19 + 1;
              lVar10 = lVar10 + 0x88;
            } while (lVar19 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}